

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O3

void __thiscall
llvm::SmallVectorTemplateBase<llvm::DWARFDie,_true>::push_back
          (SmallVectorTemplateBase<llvm::DWARFDie,_true> *this,DWARFDie *Elt)

{
  undefined8 *puVar1;
  DWARFDebugInfoEntry *pDVar2;
  uint uVar3;
  
  uVar3 = (this->super_SmallVectorTemplateCommon<llvm::DWARFDie,_void>).super_SmallVectorBase.Size;
  if ((this->super_SmallVectorTemplateCommon<llvm::DWARFDie,_void>).super_SmallVectorBase.Capacity
      <= uVar3) {
    SmallVectorBase::grow_pod((SmallVectorBase *)this,this + 1,0,0x10);
    uVar3 = (this->super_SmallVectorTemplateCommon<llvm::DWARFDie,_void>).super_SmallVectorBase.Size
    ;
  }
  pDVar2 = Elt->Die;
  puVar1 = (undefined8 *)
           ((long)(this->super_SmallVectorTemplateCommon<llvm::DWARFDie,_void>).
                  super_SmallVectorBase.BeginX + (ulong)uVar3 * 0x10);
  *puVar1 = Elt->U;
  puVar1[1] = pDVar2;
  uVar3 = (this->super_SmallVectorTemplateCommon<llvm::DWARFDie,_void>).super_SmallVectorBase.Size;
  if (uVar3 < (this->super_SmallVectorTemplateCommon<llvm::DWARFDie,_void>).super_SmallVectorBase.
              Capacity) {
    (this->super_SmallVectorTemplateCommon<llvm::DWARFDie,_void>).super_SmallVectorBase.Size =
         uVar3 + 1;
    return;
  }
  __assert_fail("N <= capacity()",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/include/llvm/ADT/SmallVector.h"
                ,0x43,"void llvm::SmallVectorBase::set_size(size_t)");
}

Assistant:

void push_back(const T &Elt) {
    if (LLVM_UNLIKELY(this->size() >= this->capacity()))
      this->grow();
    memcpy(reinterpret_cast<void *>(this->end()), &Elt, sizeof(T));
    this->set_size(this->size() + 1);
  }